

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

void __thiscall llvm::yaml::Stream::printError(Stream *this,Node *N,Twine *Msg)

{
  _Head_base<0UL,_llvm::yaml::Scanner_*,_false> _Var1;
  ArrayRef<llvm::SMRange> Ranges;
  SMRange local_10;
  
  _Var1._M_head_impl =
       (this->scanner)._M_t.
       super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>._M_t.
       super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>.
       super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>._M_head_impl;
  local_10.Start.Ptr = (N->SourceRange).Start.Ptr;
  local_10.End.Ptr = (N->SourceRange).End.Ptr;
  Ranges.Length = 1;
  Ranges.Data = &local_10;
  SourceMgr::PrintMessage
            ((_Var1._M_head_impl)->SM,local_10.Start,DK_Error,Msg,Ranges,
             (ArrayRef<llvm::SMFixIt>)ZEXT816(0),(_Var1._M_head_impl)->ShowColors);
  return;
}

Assistant:

void Stream::printError(Node *N, const Twine &Msg) {
  scanner->printError( N->getSourceRange().Start
                     , SourceMgr::DK_Error
                     , Msg
                     , N->getSourceRange());
}